

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

FunctionBody *
Js::FunctionBody::NewFromParseableFunctionInfo(ParseableFunctionInfo *parseableFunctionInfo)

{
  Recycler *pRVar1;
  FunctionBody *this;
  FunctionInfo *nestedFunc;
  FunctionInfo *nestedInfo;
  uint i;
  TrackAllocData local_50;
  FunctionBody *local_28;
  FunctionBody *functionBody;
  ScriptContext *pSStack_18;
  uint nestedCount;
  ScriptContext *scriptContext;
  ParseableFunctionInfo *parseableFunctionInfo_local;
  
  scriptContext = (ScriptContext *)parseableFunctionInfo;
  pSStack_18 = FunctionProxy::GetScriptContext(&parseableFunctionInfo->super_FunctionProxy);
  functionBody._4_4_ = ParseableFunctionInfo::GetNestedCount((ParseableFunctionInfo *)scriptContext)
  ;
  pRVar1 = ScriptContext::GetRecycler(pSStack_18);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x1fa);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_50);
  this = (FunctionBody *)new<Memory::Recycler>(0x1e8,pRVar1,0xa35d90);
  FunctionBody(this,(ParseableFunctionInfo *)scriptContext);
  local_28 = this;
  for (nestedInfo._4_4_ = 0; nestedInfo._4_4_ < functionBody._4_4_;
      nestedInfo._4_4_ = nestedInfo._4_4_ + 1) {
    nestedFunc = ParseableFunctionInfo::GetNestedFunc
                           ((ParseableFunctionInfo *)scriptContext,nestedInfo._4_4_);
    ParseableFunctionInfo::SetNestedFunc
              (&local_28->super_ParseableFunctionInfo,nestedFunc,nestedInfo._4_4_,0);
  }
  return local_28;
}

Assistant:

FunctionBody *
    FunctionBody::NewFromParseableFunctionInfo(ParseableFunctionInfo * parseableFunctionInfo)
    {
        ScriptContext * scriptContext = parseableFunctionInfo->GetScriptContext();
        uint nestedCount = parseableFunctionInfo->GetNestedCount();

        FunctionBody * functionBody = RecyclerNewWithBarrierFinalized(scriptContext->GetRecycler(),
            FunctionBody,
            parseableFunctionInfo);

        // Initialize nested function array, update back pointers
        for (uint i = 0; i < nestedCount; i++)
        {
            FunctionInfo * nestedInfo = parseableFunctionInfo->GetNestedFunc(i);
            functionBody->SetNestedFunc(nestedInfo, i, 0);
        }

        return functionBody;
    }